

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O0

bool __thiscall bloom_parameters::compute_optimal_parameters(bloom_parameters *this)

{
  unsigned_long_long uVar1;
  bool bVar2;
  optimal_parameters_t *poVar3;
  double dVar4;
  undefined1 auVar5 [16];
  long local_60;
  optimal_parameters_t *optp;
  double curr_m;
  double denominator;
  double numerator;
  double k;
  double min_k;
  double min_m;
  bloom_parameters *this_local;
  
  bVar2 = operator!(this);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    min_k = std::numeric_limits<double>::infinity();
    k = 0.0;
    for (numerator = 1.0; numerator < 1000.0; numerator = numerator + 1.0) {
      uVar1 = this->projected_element_count;
      auVar5._8_4_ = (int)(uVar1 >> 0x20);
      auVar5._0_8_ = uVar1;
      auVar5._12_4_ = 0x45300000;
      dVar4 = pow(this->false_positive_probability,1.0 / numerator);
      dVar4 = log(1.0 - dVar4);
      dVar4 = (-numerator *
              ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))) / dVar4;
      if (dVar4 < min_k) {
        k = numerator;
        min_k = dVar4;
      }
    }
    poVar3 = &this->optimal_parameters;
    poVar3->number_of_hashes = (uint)(long)k;
    (this->optimal_parameters).table_size =
         (long)min_k | (long)(min_k - 9.223372036854776e+18) & (long)min_k >> 0x3f;
    if (((this->optimal_parameters).table_size & 7) == 0) {
      local_60 = 0;
    }
    else {
      local_60 = 8 - ((this->optimal_parameters).table_size & 7);
    }
    (this->optimal_parameters).table_size = local_60 + (this->optimal_parameters).table_size;
    if (poVar3->number_of_hashes < this->minimum_number_of_hashes) {
      poVar3->number_of_hashes = this->minimum_number_of_hashes;
    }
    else if (this->maximum_number_of_hashes < poVar3->number_of_hashes) {
      poVar3->number_of_hashes = this->maximum_number_of_hashes;
    }
    if ((this->optimal_parameters).table_size < this->minimum_size) {
      (this->optimal_parameters).table_size = this->minimum_size;
    }
    else if (this->maximum_size < (this->optimal_parameters).table_size) {
      (this->optimal_parameters).table_size = this->maximum_size;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool compute_optimal_parameters()
   {
      /*
        Note:
        The following will attempt to find the number of hash functions
        and minimum amount of storage bits required to construct a bloom
        filter consistent with the user defined false positive probability
        and estimated element insertion count.
      */

      if (!(*this))
         return false;

      double min_m  = std::numeric_limits<double>::infinity();
      double min_k  = 0.0;
      double k      = 1.0;

      while (k < 1000.0)
      {
         const double numerator   = (- k * projected_element_count);
         const double denominator = std::log(1.0 - std::pow(false_positive_probability, 1.0 / k));

         const double curr_m = numerator / denominator;

         if (curr_m < min_m)
         {
            min_m = curr_m;
            min_k = k;
         }

         k += 1.0;
      }

      optimal_parameters_t& optp = optimal_parameters;

      optp.number_of_hashes = static_cast<unsigned int>(min_k);

      optp.table_size = static_cast<unsigned long long int>(min_m);

      optp.table_size += (((optp.table_size % bits_per_char) != 0) ? (bits_per_char - (optp.table_size % bits_per_char)) : 0);

      if (optp.number_of_hashes < minimum_number_of_hashes)
         optp.number_of_hashes = minimum_number_of_hashes;
      else if (optp.number_of_hashes > maximum_number_of_hashes)
         optp.number_of_hashes = maximum_number_of_hashes;

      if (optp.table_size < minimum_size)
         optp.table_size = minimum_size;
      else if (optp.table_size > maximum_size)
         optp.table_size = maximum_size;

      return true;
   }